

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O3

bool __thiscall
SkeletalMesh::Scene::getSkeletonTransform
          (Scene *this,SkeletonTransf *transf,SkeletonModifier *modifier)

{
  aiNode *paVar1;
  aiMatrix4x4 parentTransf;
  undefined1 auVar2 [40];
  aiMatrix4x4 invTransf;
  aiMatrix4x4t<float> local_68;
  
  if (this->available == true) {
    std::
    vector<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
    ::resize(transf,(long)(this->skeleton).
                          super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->skeleton).
                          super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6);
    paVar1 = this->scene->mRootNode;
    local_68.a1 = (paVar1->mTransformation).a1;
    local_68.a2 = (paVar1->mTransformation).a2;
    local_68.a3 = (paVar1->mTransformation).a3;
    local_68.a4 = (paVar1->mTransformation).a4;
    local_68.b1 = (paVar1->mTransformation).b1;
    local_68.b2 = (paVar1->mTransformation).b2;
    local_68.b3 = (paVar1->mTransformation).b3;
    local_68.b4 = (paVar1->mTransformation).b4;
    local_68.c1 = (paVar1->mTransformation).c1;
    local_68.c2 = (paVar1->mTransformation).c2;
    local_68.c3 = (paVar1->mTransformation).c3;
    local_68.c4 = (paVar1->mTransformation).c4;
    local_68.d1 = (paVar1->mTransformation).d1;
    local_68.d2 = (paVar1->mTransformation).d2;
    local_68.d3 = (paVar1->mTransformation).d3;
    local_68.d4 = (paVar1->mTransformation).d4;
    aiMatrix4x4t<float>::Inverse(&local_68);
    auVar2 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
    parentTransf.c3 = 1.0;
    parentTransf.c4 = 0.0;
    parentTransf.a1 = (float)auVar2._0_4_;
    parentTransf.a2 = (float)auVar2._4_4_;
    parentTransf.a3 = (float)auVar2._8_4_;
    parentTransf.a4 = (float)auVar2._12_4_;
    parentTransf.b1 = (float)auVar2._16_4_;
    parentTransf.b2 = (float)auVar2._20_4_;
    parentTransf.b3 = (float)auVar2._24_4_;
    parentTransf.b4 = (float)auVar2._28_4_;
    parentTransf.c1 = (float)auVar2._32_4_;
    parentTransf.c2 = (float)auVar2._36_4_;
    parentTransf.d1 = 0.0;
    parentTransf.d2 = 0.0;
    parentTransf.d3 = 0.0;
    parentTransf.d4 = 1.0;
    recursivelyGetTransf(this,transf,modifier,this->scene->mRootNode,parentTransf,&local_68);
    return (transf->
           super__Vector_base<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_start !=
           (transf->
           super__Vector_base<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool getSkeletonTransform(SkeletonTransf &transf, SkeletonModifier &modifier) const {
            if (!available) return false;

            transf.resize(skeleton.size());

            aiMatrix4x4 identityMtrx, invTransf = scene->mRootNode->mTransformation;
            invTransf.Inverse();
            recursivelyGetTransf(transf, modifier, scene->mRootNode, identityMtrx, invTransf);
            return !transf.empty();
        }